

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_base_test.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_40d3a::Composite::~Composite(Composite *this)

{
  mwheel::CompositeBase<(anonymous_namespace)::Base,_std::shared_ptr<(anonymous_namespace)::Base>_>
  ::~CompositeBase(&this->
                    super_CompositeBase<(anonymous_namespace)::Base,_std::shared_ptr<(anonymous_namespace)::Base>_>
                  );
  operator_delete(this);
  return;
}

Assistant:

int get() const override {
    auto sum = 0;
    for (const auto &x : m_items) {
      sum += x->get();
    }
    return sum;
  }